

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O0

void HttpReqThread::iter_body_table(vm_val_t *key,vm_val_t *val,void *ctx0)

{
  int iVar1;
  char *pcVar2;
  char *name;
  char *filename;
  long lVar3;
  char *field_val;
  vm_val_t new_str;
  size_t fname_len;
  char *fname;
  size_t ctype_len;
  char *ctype;
  CVmDataSource *src;
  char *def_ctype;
  vm_val_t fname_val;
  vm_val_t ctype_val;
  vm_val_t file_val;
  char *field_name;
  iter_body_table_ctx *ctx;
  char **in_stack_000003b0;
  vm_val_t *in_stack_000003b8;
  vm_val_t *in_stack_ffffffffffffff38;
  vm_rcdesc *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  vm_val_t *in_stack_ffffffffffffff50;
  vm_val_t *in_stack_ffffffffffffff58;
  CVmRun *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  OS_HttpPayload *in_stack_ffffffffffffff80;
  vm_val_t *in_stack_ffffffffffffff88;
  OS_HttpPayload *this;
  OS_HttpPayload *pOVar4;
  CVmDataSource *in_stack_ffffffffffffffa8;
  
  pcVar2 = vm_val_t::get_as_string(in_stack_ffffffffffffff38);
  if (pcVar2 != (char *)0x0) {
    iVar1 = vm_val_t::is_instance_of
                      ((vm_val_t *)in_stack_ffffffffffffff40,
                       (vm_obj_id_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    if (iVar1 == 0) {
      pcVar2 = vm_val_t::cast_to_string
                         (in_stack_ffffffffffffff88,(vm_val_t *)in_stack_ffffffffffffff80);
      if (pcVar2 != (char *)0x0) {
        OS_HttpPayload::add_tstr
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
    }
    else {
      CVmRun::get_prop(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50
                       ,(vm_prop_id_t)((ulong)in_stack_ffffffffffffff48 >> 0x30),
                       (uint)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      CVmRun::get_prop(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50
                       ,(vm_prop_id_t)((ulong)in_stack_ffffffffffffff48 >> 0x30),
                       (uint)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      CVmRun::get_prop(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50
                       ,(vm_prop_id_t)((ulong)in_stack_ffffffffffffff48 >> 0x30),
                       (uint)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      this = (OS_HttpPayload *)0x0;
      val_to_ds(in_stack_000003b8,in_stack_000003b0);
      pcVar2 = vm_val_t::get_as_string(in_stack_ffffffffffffff38);
      pOVar4 = this;
      if (pcVar2 == (char *)0x0) {
        name = (char *)strlen((char *)this);
      }
      else {
        name = (char *)vmb_get_len((char *)0x25297c);
        this = (OS_HttpPayload *)(pcVar2 + 2);
      }
      pcVar2 = vm_val_t::get_as_string(in_stack_ffffffffffffff38);
      if (pcVar2 == (char *)0x0) {
        filename = (char *)0x0;
      }
      else {
        filename = (char *)vmb_get_len((char *)0x2529cb);
      }
      lVar3 = 0;
      if (pcVar2 != (char *)0x0) {
        lVar3 = 2;
      }
      pcVar2 = pcVar2 + lVar3;
      vmb_get_len((char *)0x252a38);
      OS_HttpPayload::add(this,name,(size_t)pcVar2,filename,(size_t)in_stack_ffffffffffffff70,
                          in_stack_ffffffffffffff68,(size_t)pOVar4,in_stack_ffffffffffffffa8);
    }
  }
  return;
}

Assistant:

static void iter_body_table(
        VMG_ const vm_val_t *key, const vm_val_t *val, void *ctx0)
    {
        /* get the context */
        iter_body_table_ctx *ctx = (iter_body_table_ctx *)ctx0;

        /* the key must be a string giving the field name */
        const char *field_name = key->get_as_string(vmg0_);
        if (field_name == 0)
            return;

        /* 
         *   the value must be either a string giving the simple form field
         *   value, or a FileUpload object giving a file to upload 
         */
        if (val->is_instance_of(vmg_ G_predef->file_upload_cl))
        {
            /* 
             *   It's a FileUpload object.  The 'file' property is the
             *   content object, which must be provided as a string or
             *   ByteArray; the 'filename' and 'contentType' properties are
             *   strings giving us details on how to treat the content data. 
             */

            /* retrieve the property values we're interested in */
            vm_val_t file_val, ctype_val, fname_val;
            G_interpreter->get_prop(
                vmg_ &file_val, val, G_predef->file_upload_fileObj, 0,
                ctx->rc);
            G_interpreter->get_prop(
                vmg_ &ctype_val, val, G_predef->file_upload_contentType, 0,
                ctx->rc);
            G_interpreter->get_prop(
                vmg_ &fname_val, val, G_predef->file_upload_filename, 0,
                ctx->rc);

            /* wrap the 'file' value in a datasource */
            const char *def_ctype = 0;
            CVmDataSource *src = val_to_ds(vmg_ &file_val, &def_ctype);

            /* if we have a contentType string, override the default */
            const char *ctype = ctype_val.get_as_string(vmg0_);
            size_t ctype_len;
            if (ctype != 0)
            {
                /* they specified a content type - use their value */
                ctype_len = vmb_get_len(ctype);
                ctype += VMB_LEN;
            }
            else
            {
                /* use the default */
                ctype = def_ctype;
                ctype_len = strlen(def_ctype);
            }

            /* get the filename string, if they provided one */
            const char *fname = fname_val.get_as_string(vmg0_);
            size_t fname_len = (fname != 0 ? vmb_get_len(fname) : 0);
            fname += (fname != 0 ? VMB_LEN : 0);

            /* add the field */
            ctx->self->body->add(
                field_name + VMB_LEN, vmb_get_len(field_name),
                fname, fname_len, ctype, ctype_len, src);
        }
        else
        {
            /* get a string interpretation of the value */
            vm_val_t new_str;
            const char *field_val = val->cast_to_string(vmg_ &new_str);
            if (field_val == 0)
                return;

            /* add the field to the payload */
            ctx->self->body->add_tstr(field_name, field_val);
        }
    }